

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardWriterPageState<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
~StandardWriterPageState
          (StandardWriterPageState<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
           *this)

{
  DlbaEncoder *in_RDI;
  
  (in_RDI->dbp_encoder).total_value_count = (idx_t)&PTR__StandardWriterPageState_00bfe558;
  BssEncoder::~BssEncoder((BssEncoder *)0x6005fd);
  DlbaEncoder::~DlbaEncoder(in_RDI);
  ColumnWriterPageState::~ColumnWriterPageState((ColumnWriterPageState *)in_RDI);
  return;
}

Assistant:

explicit StandardWriterPageState(const idx_t total_value_count, const idx_t total_string_size,
	                                 duckdb_parquet::Encoding::type encoding_p,
	                                 const PrimitiveDictionary<SRC, TGT, OP> &dictionary_p)
	    : encoding(encoding_p), dbp_initialized(false), dbp_encoder(total_value_count), dlba_initialized(false),
	      dlba_encoder(total_value_count, total_string_size), bss_initialized(false),
	      bss_encoder(total_value_count, sizeof(TGT)), dictionary(dictionary_p), dict_written_value(false),
	      dict_bit_width(RleBpDecoder::ComputeBitWidth(dictionary.GetSize())), dict_encoder(dict_bit_width) {
	}